

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void throw(hd_context *ctx)

{
  hd_error_context *phVar1;
  hd_error_stack_slot *phVar2;
  
  phVar1 = ctx->error;
  phVar2 = phVar1->top;
  if (phVar2 < phVar1->stack) {
    fprintf(_stderr,"uncaught exception: %s\n",phVar1->message);
    exit(1);
  }
  phVar2->code = phVar2->code + 2;
  siglongjmp((__jmp_buf_tag *)phVar2->buffer,1);
}

Assistant:

HD_NORETURN static void throw(hd_context *ctx)
{
    if (ctx->error->top >= ctx->error->stack)
    {
        ctx->error->top->code += 2;
        hd_longjmp(ctx->error->top->buffer, 1);
    }
    else
    {
        fprintf(stderr, "uncaught exception: %s\n", ctx->error->message);
#ifdef USE_OUTPUT_DEBUG_STRING
        OutputDebugStringA("uncaught exception: ");
		OutputDebugStringA(ctx->error->message);
		OutputDebugStringA("\n");
#endif
        exit(EXIT_FAILURE);
    }
}